

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool __thiscall
cmGeneratorTarget::StrictTargetComparison::operator()
          (StrictTargetComparison *this,cmGeneratorTarget *t1,cmGeneratorTarget *t2)

{
  int iVar1;
  char *__s1;
  char *__s2;
  
  iVar1 = strcmp((t1->Target->Name)._M_dataplus._M_p,(t2->Target->Name)._M_dataplus._M_p);
  if (iVar1 == 0) {
    __s1 = cmLocalGenerator::GetCurrentBinaryDirectory(t1->LocalGenerator);
    __s2 = cmLocalGenerator::GetCurrentBinaryDirectory(t2->LocalGenerator);
    iVar1 = strcmp(__s1,__s2);
  }
  return SUB41((uint)iVar1 >> 0x1f,0);
}

Assistant:

bool cmGeneratorTarget::StrictTargetComparison::operator()(
    cmGeneratorTarget const* t1, cmGeneratorTarget const* t2) const
{
  int nameResult = strcmp(t1->GetName().c_str(), t2->GetName().c_str());
  if (nameResult == 0)
    {
    return strcmp(t1->GetLocalGenerator()->GetCurrentBinaryDirectory(),
                  t2->GetLocalGenerator()->GetCurrentBinaryDirectory()) < 0;
    }
  return nameResult < 0;
}